

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O0

AssertionResult __thiscall
testing::internal::
CmpHelperEQFailure<bidfx_public_api::price::pixie::FieldDef,std::optional<bidfx_public_api::price::pixie::FieldDef>>
          (internal *this,char *lhs_expression,char *rhs_expression,FieldDef *lhs,
          optional<bidfx_public_api::price::pixie::FieldDef> *rhs)

{
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  extraout_RDX;
  AssertionResult AVar1;
  string local_70;
  string local_50;
  internal *local_30;
  optional<bidfx_public_api::price::pixie::FieldDef> *rhs_local;
  FieldDef *lhs_local;
  char *rhs_expression_local;
  char *lhs_expression_local;
  
  local_30 = (internal *)rhs;
  rhs_local = (optional<bidfx_public_api::price::pixie::FieldDef> *)lhs;
  lhs_local = (FieldDef *)rhs_expression;
  rhs_expression_local = lhs_expression;
  lhs_expression_local = (char *)this;
  FormatForComparisonFailureMessage<bidfx_public_api::price::pixie::FieldDef,std::optional<bidfx_public_api::price::pixie::FieldDef>>
            (&local_50,(internal *)lhs,(FieldDef *)rhs,
             (optional<bidfx_public_api::price::pixie::FieldDef> *)lhs);
  FormatForComparisonFailureMessage<std::optional<bidfx_public_api::price::pixie::FieldDef>,bidfx_public_api::price::pixie::FieldDef>
            (&local_70,local_30,rhs_local,lhs);
  EqFailure(this,lhs_expression,rhs_expression,&local_50,&local_70,false);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  AVar1.message_.ptr_ = extraout_RDX.ptr_;
  AVar1._0_8_ = this;
  return AVar1;
}

Assistant:

AssertionResult CmpHelperEQFailure(const char* lhs_expression,
                                   const char* rhs_expression,
                                   const T1& lhs, const T2& rhs) {
  return EqFailure(lhs_expression,
                   rhs_expression,
                   FormatForComparisonFailureMessage(lhs, rhs),
                   FormatForComparisonFailureMessage(rhs, lhs),
                   false);
}